

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

SQInteger __thiscall SQBlob::Seek(SQBlob *this,SQInteger offset,SQInteger origin)

{
  SQInteger origin_local;
  SQInteger offset_local;
  SQBlob *this_local;
  
  if (origin == 0) {
    if ((this->_size < this->_ptr + offset) || (this->_ptr + offset < 0)) {
      return -1;
    }
    this->_ptr = offset + this->_ptr;
  }
  else if (origin == 1) {
    if ((this->_size < this->_size + offset) || (this->_size + offset < 0)) {
      return -1;
    }
    this->_ptr = this->_size + offset;
  }
  else {
    if (origin != 2) {
      return -1;
    }
    if ((this->_size < offset) || (offset < 0)) {
      return -1;
    }
    this->_ptr = offset;
  }
  return 0;
}

Assistant:

SQInteger Seek(SQInteger offset, SQInteger origin) {
        switch(origin) {
            case SQ_SEEK_SET:
                if(offset > _size || offset < 0) return -1;
                _ptr = offset;
                break;
            case SQ_SEEK_CUR:
                if(_ptr + offset > _size || _ptr + offset < 0) return -1;
                _ptr += offset;
                break;
            case SQ_SEEK_END:
                if(_size + offset > _size || _size + offset < 0) return -1;
                _ptr = _size + offset;
                break;
            default: return -1;
        }
        return 0;
    }